

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValue<int>(BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   *this,int *key,EquivalentPropertyEntry **value)

{
  Type piVar1;
  uint uVar2;
  Type this_00;
  uint uVar3;
  
  piVar1 = this->buckets;
  uVar2 = 0;
  if (piVar1 != (Type)0x0) {
    uVar2 = GetBucket(*key * 2 + 1,this->bucketCount,this->modFunctionIndex);
    uVar3 = piVar1[uVar2];
    uVar2 = 0;
    if (-1 < (int)uVar3) {
      uVar2 = 0;
      do {
        if (this->entries[uVar3].
            super_DefaultHashedEntry<int,_Js::EquivalentPropertyEntry_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<int,_Js::EquivalentPropertyEntry_*>.
            super_ValueEntry<Js::EquivalentPropertyEntry_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Js::EquivalentPropertyEntry_*>_>
            .super_KeyValueEntryDataLayout2<int,_Js::EquivalentPropertyEntry_*>.key == *key) {
          this_00 = this->stats;
          goto LAB_005f5a79;
        }
        uVar2 = uVar2 + 1;
        uVar3 = this->entries[uVar3].
                super_DefaultHashedEntry<int,_Js::EquivalentPropertyEntry_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<int,_Js::EquivalentPropertyEntry_*>.
                super_ValueEntry<Js::EquivalentPropertyEntry_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Js::EquivalentPropertyEntry_*>_>
                .super_KeyValueEntryDataLayout2<int,_Js::EquivalentPropertyEntry_*>.next;
      } while (-1 < (int)uVar3);
    }
  }
  this_00 = this->stats;
  uVar3 = 0xffffffff;
LAB_005f5a79:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar2);
  }
  if (-1 < (int)uVar3) {
    *value = this->entries[uVar3].
             super_DefaultHashedEntry<int,_Js::EquivalentPropertyEntry_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             .super_KeyValueEntry<int,_Js::EquivalentPropertyEntry_*>.
             super_ValueEntry<Js::EquivalentPropertyEntry_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Js::EquivalentPropertyEntry_*>_>
             .super_KeyValueEntryDataLayout2<int,_Js::EquivalentPropertyEntry_*>.value;
  }
  return -1 < (int)uVar3;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }